

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O0

void do_close(uv_tcp_t *handle)

{
  int iVar1;
  uv_tcp_t *handle_local;
  
  if (shutdown_before_close == 1) {
    iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-reset.c"
              ,0x42,"0 == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)");
      abort();
    }
    iVar1 = uv_tcp_close_reset(handle,close_cb);
    if (iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-reset.c"
              ,0x43,"UV_EINVAL == uv_tcp_close_reset(handle, close_cb)");
      abort();
    }
  }
  else {
    iVar1 = uv_tcp_close_reset(handle,close_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-reset.c"
              ,0x45,"0 == uv_tcp_close_reset(handle, close_cb)");
      abort();
    }
    iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
    if (iVar1 != -0x6b) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-reset.c"
              ,0x46,"UV_ENOTCONN == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)")
      ;
      abort();
    }
  }
  uv_close(&tcp_server,0);
  return;
}

Assistant:

static void do_close(void* handle) {
  close_cb_called = 0;
  uv_close((uv_handle_t*)handle, close_cb);
  ASSERT(close_cb_called == 0);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(close_cb_called == 1);
}